

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,char *c,bool raw)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,c,&local_39);
  FBXExportProperty(this,&local_38,raw);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const char* c, bool raw)
: FBXExportProperty(std::string(c), raw) {
    // empty
}